

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

NodeRecord * __thiscall
embree::avx::CreateMortonLeaf<4,_embree::TriangleMv<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::TriangleMv<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  FastAllocator *this_00;
  ThreadLocal *pTVar7;
  ThreadLocal2 *pTVar8;
  iterator __position;
  TriangleMesh *pTVar9;
  BuildPrim *pBVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  size_t sVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vuint4 vgeomID;
  vuint4 vprimID;
  undefined1 local_f8 [16];
  ThreadLocal2 *local_e8;
  undefined1 uStack_e0;
  undefined7 uStack_df;
  undefined1 auStack_d8 [16];
  undefined1 auStack_c8 [16];
  ThreadLocal2 *local_b8;
  char cStack_b0;
  undefined7 uStack_af;
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  CreateMortonLeaf<4,_embree::TriangleMv<4>_> *local_80;
  ThreadLocal2 *local_78;
  undefined8 uStack_70;
  undefined1 auStack_68 [16];
  undefined1 auStack_58 [16];
  undefined1 local_48 [16];
  
  auVar29 = in_ZMM4._0_16_;
  auVar24 = in_ZMM2._0_16_;
  uVar3 = current->_begin;
  uVar4 = current->_end;
  this_00 = alloc->alloc;
  pTVar7 = alloc->talloc1;
  local_f8._8_8_ = local_f8._0_8_;
  local_f8._0_8_ = 0xb0;
  pTVar8 = pTVar7->parent;
  local_80 = this;
  if (this_00 != (pTVar8->alloc)._M_b._M_p) {
    cStack_b0 = '\x01';
    local_b8 = pTVar8;
    MutexSys::lock(&pTVar8->mutex);
    if ((pTVar8->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesUsed + (pTVar8->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar8->alloc0).end + (pTVar8->alloc1).end) -
           ((pTVar8->alloc0).cur + (pTVar8->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar8->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar8->alloc1).bytesWasted + (pTVar8->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar25 = ZEXT1632(ZEXT816(0) << 0x40);
    (pTVar8->alloc0).end = auVar25._0_8_;
    (pTVar8->alloc0).allocBlockSize = auVar25._8_8_;
    (pTVar8->alloc0).bytesUsed = auVar25._16_8_;
    (pTVar8->alloc0).bytesWasted = auVar25._24_8_;
    (pTVar8->alloc0).ptr = (char *)auVar25._0_8_;
    (pTVar8->alloc0).cur = auVar25._8_8_;
    (pTVar8->alloc0).end = auVar25._16_8_;
    (pTVar8->alloc0).allocBlockSize = auVar25._24_8_;
    auVar25 = ZEXT1632(ZEXT816(0) << 0x40);
    if (this_00 == (FastAllocator *)0x0) {
      (pTVar8->alloc1).end = auVar25._0_8_;
      (pTVar8->alloc1).allocBlockSize = auVar25._8_8_;
      (pTVar8->alloc1).bytesUsed = auVar25._16_8_;
      (pTVar8->alloc1).bytesWasted = auVar25._24_8_;
      (pTVar8->alloc1).ptr = (char *)auVar25._0_8_;
      (pTVar8->alloc1).cur = auVar25._8_8_;
      (pTVar8->alloc1).end = auVar25._16_8_;
      (pTVar8->alloc1).allocBlockSize = auVar25._24_8_;
    }
    else {
      (pTVar8->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (pTVar8->alloc1).ptr = (char *)auVar25._0_8_;
      (pTVar8->alloc1).cur = auVar25._8_8_;
      (pTVar8->alloc1).end = auVar25._16_8_;
      (pTVar8->alloc1).allocBlockSize = auVar25._24_8_;
      (pTVar8->alloc1).end = auVar25._0_8_;
      (pTVar8->alloc1).allocBlockSize = auVar25._8_8_;
      (pTVar8->alloc1).bytesUsed = auVar25._16_8_;
      (pTVar8->alloc1).bytesWasted = auVar25._24_8_;
      (pTVar8->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (pTVar8->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = 1;
    local_78 = pTVar8;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_78);
    }
    else {
      *__position._M_current = pTVar8;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (cStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  uVar16 = local_f8._0_8_;
  pTVar7->bytesUsed = (long)&((MutexSys *)local_f8._0_8_)->mutex + pTVar7->bytesUsed;
  sVar19 = pTVar7->cur;
  uVar20 = (ulong)(-(int)sVar19 & 0xf);
  uVar17 = (long)&((MutexSys *)local_f8._0_8_)->mutex + uVar20 + sVar19;
  pTVar7->cur = uVar17;
  if (pTVar7->end < uVar17) {
    pTVar7->cur = sVar19;
    pTVar8 = (ThreadLocal2 *)pTVar7->allocBlockSize;
    if ((ThreadLocal2 *)(local_f8._0_8_ * 4) < pTVar8 || local_f8._0_8_ * 4 - (long)pTVar8 == 0) {
      local_e8 = pTVar8;
      pauVar18 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar7->ptr = (char *)pauVar18;
      sVar19 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
      pTVar7->bytesWasted = sVar19;
      pTVar7->end = (size_t)local_e8;
      pTVar7->cur = uVar16;
      if (local_e8 < (ulong)uVar16) {
        pTVar7->cur = 0;
        local_e8 = (ThreadLocal2 *)pTVar7->allocBlockSize;
        pauVar18 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar7->ptr = (char *)pauVar18;
        sVar19 = (pTVar7->end - pTVar7->cur) + pTVar7->bytesWasted;
        pTVar7->bytesWasted = sVar19;
        pTVar7->end = (size_t)local_e8;
        pTVar7->cur = uVar16;
        if (local_e8 < (ulong)uVar16) {
          pTVar7->cur = 0;
          pauVar18 = (undefined1 (*) [16])0x0;
          goto LAB_0146fb87;
        }
      }
      pTVar7->bytesWasted = sVar19;
    }
    else {
      pauVar18 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_f8);
    }
  }
  else {
    pTVar7->bytesWasted = pTVar7->bytesWasted + uVar20;
    pauVar18 = (undefined1 (*) [16])(pTVar7->ptr + (uVar17 - local_f8._0_8_));
  }
LAB_0146fb87:
  local_48 = vpcmpeqd_avx(auVar24,auVar24);
  local_e8 = (ThreadLocal2 *)0x0;
  auStack_c8 = (undefined1  [16])0x0;
  uStack_e0 = 0;
  uStack_df = 0;
  auStack_d8 = (undefined1  [16])0x0;
  auStack_98 = (undefined1  [16])0x0;
  auStack_a8 = (undefined1  [16])0x0;
  auStack_58 = (undefined1  [16])0x0;
  uStack_70 = 0;
  auStack_68 = (undefined1  [16])0x0;
  if (uVar4 == uVar3) {
    auVar24._8_4_ = 0x7f800000;
    auVar24._0_8_ = 0x7f8000007f800000;
    auVar24._12_4_ = 0x7f800000;
    aVar26.m128[2] = -INFINITY;
    aVar26._0_8_ = 0xff800000ff800000;
    aVar26.m128[3] = -INFINITY;
    auStack_58 = ZEXT816(0) << 0x40;
    local_f8 = vpcmpeqd_avx(auVar29,auVar29);
    auStack_68 = ZEXT816(0) << 0x40;
    auVar27 = ZEXT816(0) << 0x40;
    auStack_98 = ZEXT816(0) << 0x40;
    auStack_a8 = ZEXT816(0) << 0x40;
    auVar28 = ZEXT816(0) << 0x40;
    auStack_c8 = ZEXT816(0) << 0x40;
    auStack_d8 = ZEXT816(0) << 0x40;
    auVar29 = ZEXT816(0) << 0x40;
  }
  else {
    iVar21 = uVar4 - uVar3;
    pTVar9 = local_80->mesh;
    pBVar10 = local_80->morton;
    lVar11 = *(long *)&(pTVar9->super_Geometry).field_0x58;
    lVar12 = *(long *)&pTVar9->field_0x68;
    pcVar13 = (pTVar9->vertices0).super_RawBufferView.ptr_ofs;
    sVar19 = (pTVar9->vertices0).super_RawBufferView.stride;
    uVar4 = local_80->geomID_;
    aVar26.m128[2] = -INFINITY;
    aVar26._0_8_ = 0xff800000ff800000;
    aVar26.m128[3] = -INFINITY;
    auVar24._8_4_ = 0x7f800000;
    auVar24._0_8_ = 0x7f8000007f800000;
    auVar24._12_4_ = 0x7f800000;
    lVar22 = 0;
    local_f8 = local_48;
    local_b8 = local_e8;
    cStack_b0 = uStack_e0;
    uStack_af = uStack_df;
    local_78 = local_e8;
    do {
      uVar5 = *(uint *)((long)&pBVar10[uVar3].field_0 + lVar22 * 2 + 4);
      lVar23 = (ulong)uVar5 * lVar12;
      auVar29 = *(undefined1 (*) [16])(pcVar13 + *(uint *)(lVar11 + lVar23) * sVar19);
      auVar28 = *(undefined1 (*) [16])(pcVar13 + *(uint *)(lVar11 + 4 + lVar23) * sVar19);
      auVar27 = *(undefined1 (*) [16])(pcVar13 + *(uint *)(lVar11 + 8 + lVar23) * sVar19);
      auVar24 = vminps_avx(auVar24,auVar29);
      auVar15 = vminps_avx(auVar28,auVar27);
      auVar24 = vminps_avx(auVar24,auVar15);
      *(int *)((long)&local_e8 + lVar22) = auVar29._0_4_;
      uVar6 = vextractps_avx(auVar29,1);
      *(undefined4 *)(auStack_d8 + lVar22) = uVar6;
      auVar15 = vmaxps_avx((undefined1  [16])aVar26,auVar29);
      uVar6 = vextractps_avx(auVar29,2);
      *(undefined4 *)(auStack_c8 + lVar22) = uVar6;
      *(int *)((long)&local_b8 + lVar22) = auVar28._0_4_;
      uVar6 = vextractps_avx(auVar28,1);
      *(undefined4 *)(auStack_a8 + lVar22) = uVar6;
      auVar29 = vmaxps_avx(auVar28,auVar27);
      uVar6 = vextractps_avx(auVar28,2);
      *(undefined4 *)(auStack_98 + lVar22) = uVar6;
      *(int *)((long)&local_78 + lVar22) = auVar27._0_4_;
      uVar6 = vextractps_avx(auVar27,1);
      *(undefined4 *)(auStack_68 + lVar22) = uVar6;
      aVar26 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vmaxps_avx(auVar15,auVar29);
      uVar6 = vextractps_avx(auVar27,2);
      *(undefined4 *)(auStack_58 + lVar22) = uVar6;
      *(uint *)(local_f8 + lVar22) = uVar4;
      *(uint *)(local_48 + lVar22) = uVar5;
      lVar22 = lVar22 + 4;
    } while ((ulong)(iVar21 + (uint)(iVar21 == 0)) << 2 != lVar22);
    auVar29[8] = uStack_e0;
    auVar29._0_8_ = local_e8;
    auVar29._9_7_ = uStack_df;
    auVar28[8] = cStack_b0;
    auVar28._0_8_ = local_b8;
    auVar28._9_7_ = uStack_af;
    auVar27._8_8_ = uStack_70;
    auVar27._0_8_ = local_78;
  }
  auVar29 = vmovntps_avx(auVar29);
  *pauVar18 = auVar29;
  auVar29 = vmovntps_avx(auStack_d8);
  pauVar18[1] = auVar29;
  auVar29 = vmovntps_avx(auStack_c8);
  pauVar18[2] = auVar29;
  auVar29 = vmovntps_avx(auVar28);
  pauVar18[3] = auVar29;
  auVar29 = vmovntps_avx(auStack_a8);
  pauVar18[4] = auVar29;
  auVar29 = vmovntps_avx(auStack_98);
  pauVar18[5] = auVar29;
  auVar29 = vmovntps_avx(auVar27);
  pauVar18[6] = auVar29;
  auVar29 = vmovntps_avx(auStack_68);
  pauVar18[7] = auVar29;
  auVar29 = vmovntps_avx(auStack_58);
  pauVar18[8] = auVar29;
  auVar29 = vmovntdq_avx(local_f8);
  pauVar18[9] = auVar29;
  auVar29 = vmovntdq_avx(local_48);
  pauVar18[10] = auVar29;
  aVar14 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
           vinsertps_avx(auVar24,ZEXT416(current->_end - current->_begin),0x30);
  (__return_storage_ptr__->ref).ptr = (ulong)pauVar18 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar14;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar26;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4v* accel = (Triangle4v*) alloc.malloc1(sizeof(Triangle4v),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);       
        vuint4 vgeomID = -1, vprimID = -1;
        Vec3vf4 v0 = zero, v1 = zero, v2 = zero;
        const TriangleMesh* __restrict__ mesh = this->mesh;

        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID [i] = geomID_;
          vprimID [i] = primID;
          v0.x[i] = p0.x; v0.y[i] = p0.y; v0.z[i] = p0.z;
          v1.x[i] = p1.x; v1.y[i] = p1.y; v1.z[i] = p1.z;
          v2.x[i] = p2.x; v2.y[i] = p2.y; v2.z[i] = p2.z;
        }
        Triangle4v::store_nt(accel,Triangle4v(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }